

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_int8.h
# Opt level: O0

void ncnn::convolution_int8
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  int *piVar1;
  char *pcVar2;
  int in_ECX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  char w_1;
  char val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  allocator_type *__a;
  undefined2 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaa;
  undefined1 in_stack_fffffffffffffeab;
  undefined4 in_stack_fffffffffffffeac;
  int iVar3;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  Mat *in_stack_fffffffffffffeb8;
  int local_fc;
  char *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  Mat local_e0;
  int *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  reference local_78;
  allocator_type local_59;
  vector<int,_std::allocator<int>_> local_58;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  Mat *local_18;
  
  local_28 = *(int *)(in_RDI + 0x2c);
  local_2c = *(int *)(in_RDI + 0x38);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x38);
  local_3c = in_ECX * in_R8D;
  __a = &local_59;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::allocator<int>::allocator((allocator<int> *)0x2b01d4);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffeb0,
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT13(in_stack_fffffffffffffeab,
                               CONCAT12(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8))),__a);
  std::allocator<int>::~allocator((allocator<int> *)0x2b01fa);
  local_78 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,0);
  local_7c = 0;
  local_80 = 0;
  local_84 = local_28 * in_stack_00000008 - local_1c * local_24;
  for (local_88 = 0; local_88 < local_20; local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < local_1c; local_8c = local_8c + 1) {
      local_78[local_7c] = local_80;
      local_7c = local_7c + 1;
      local_80 = local_24 + local_80;
    }
    local_80 = local_84 + local_80;
  }
  for (local_90 = 0; local_90 < local_38; local_90 = local_90 + 1) {
    Mat::channel(in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    piVar1 = Mat::operator_cast_to_int_(&local_e0);
    Mat::~Mat((Mat *)0x2b038a);
    local_98 = piVar1;
    for (local_e4 = 0; local_e4 < local_34; local_e4 = local_e4 + 1) {
      for (local_e8 = 0; local_e8 < local_30; local_e8 = local_e8 + 1) {
        local_ec = 0;
        local_f8 = Mat::operator_cast_to_signed_char_(local_18);
        local_f8 = local_f8 + local_3c * local_2c * local_90;
        for (local_fc = 0; local_fc < local_2c; local_fc = local_fc + 1) {
          Mat::channel(in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          pcVar2 = Mat::row<signed_char>
                             ((Mat *)&stack0xfffffffffffffeb8,local_e4 * in_stack_00000018);
          in_stack_fffffffffffffeb0 =
               (vector<int,_std::allocator<int>_> *)(pcVar2 + local_e8 * in_stack_00000010);
          for (iVar3 = 0; iVar3 < local_3c; iVar3 = iVar3 + 1) {
            local_ec = (int)*(char *)((long)&(in_stack_fffffffffffffeb0->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start +
                                     (long)local_78[iVar3]) * (int)local_f8[iVar3] + local_ec;
          }
          local_f8 = local_f8 + local_3c;
          Mat::~Mat((Mat *)0x2b0531);
        }
        local_98[local_e8] = local_ec;
      }
      local_98 = local_98 + local_30;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  return;
}

Assistant:

static void convolution_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                //                 const signed char* kptr = weight_data_int8.channel(p);
                const signed char* kptr = (const signed char*)weight_data_int8 + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }
}